

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  buffer<char> *pbVar11;
  int iVar12;
  uint uVar13;
  result rVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  char cVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  size_t __len;
  ulong uVar29;
  boundaries bVar30;
  int exp;
  fixed_handler handler;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  fixed_handler local_78;
  buffer<char> *local_60;
  double local_58;
  fp local_50;
  uint64_t local_40;
  float_specs local_38;
  
  if (value < 0.0) {
    assert_fail((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,
                (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  uVar16 = (ulong)(uint)precision;
  uVar22 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar22 == 0x200000000) {
      if (buf->capacity_ < uVar16) {
        (**buf->_vptr_buffer)(buf,uVar16);
      }
      buf->size_ = uVar16;
      memset(buf->ptr_,0x30,uVar16);
      return -precision;
    }
    sVar15 = buf->size_;
    uVar16 = sVar15 + 1;
    if (buf->capacity_ < uVar16) {
      (**buf->_vptr_buffer)(buf);
      sVar15 = buf->size_;
      uVar16 = sVar15 + 1;
    }
    buf->size_ = uVar16;
    buf->ptr_[sVar15] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  iVar12 = 0;
  if (precision < 0) {
    local_50.f = 0;
    local_50.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      local_58 = value;
      bVar30 = fp::assign_with_boundaries<double>(&local_50,value);
    }
    else {
      local_58 = value;
      bVar30 = fp::assign_float_with_boundaries<double>(&local_50,value);
    }
    if ((local_50.f >> 0x34 & 1) == 0) {
      lVar21 = 0x3f;
      if ((local_50.f & 0xfffffffffffff) != 0) {
        for (; (local_50.f & 0xfffffffffffff) >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      local_50.f = local_50.f << (~(byte)lVar21 + 0x35 & 0x3f);
      local_50.e = (local_50.e - ((uint)lVar21 ^ 0x3f)) + 0xb;
    }
    iVar25 = (int)((ulong)((long)(-0x32 - local_50.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar13 = iVar25 + 0x15b;
    uVar19 = iVar25 + 0x162;
    if (-1 < (int)uVar13) {
      uVar19 = uVar13;
    }
    uVar16 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar19 >> 3) * 8 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar16;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_50.f << 0xb;
    local_50.f = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
    iVar25 = local_50.e +
             *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar19 >> 3) * 2 + 2) + 0x35
    ;
    if (0x1c < local_50.e +
               *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar19 >> 3) * 2 + 2) +
               0x71U) {
      local_50.e = iVar25;
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/spdlog/fmt/bundled/format-inl.h"
                    ,0x435,
                    "int fmt::internal::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                   );
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar16;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = bVar30.upper;
    lVar21 = SUB168(auVar3 * auVar7,8);
    lVar26 = -(SUB168(auVar3 * auVar7,0) >> 0x3f);
    uVar29 = lVar21 + lVar26 + 1;
    local_78.buf = buf->ptr_;
    local_78._16_8_ = uVar29 - local_50.f;
    bVar18 = -(char)iVar25;
    uVar27 = 1L << (bVar18 & 0x3f);
    uVar22 = uVar29 >> (bVar18 & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar16;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar30.lower;
    local_78.size = 0;
    uVar13 = (uint)uVar22;
    local_50.e = iVar25;
    if (uVar13 == 0) {
LAB_001441d2:
      local_78.size = 0;
      assert_fail((char *)CONCAT44(iVar12,in_stack_ffffffffffffff70),0,
                  (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    uVar16 = uVar27 - 1;
    uVar20 = 1;
    if (((((9 < uVar13) && (uVar20 = 2, 99 < uVar13)) && (uVar20 = 3, 999 < uVar13)) &&
        ((uVar20 = 4, 9999 < uVar13 && (uVar20 = 5, 99999 < uVar13)))) &&
       ((uVar20 = 6, 999999 < uVar13 &&
        ((uVar20 = 7, 9999999 < uVar13 && (uVar20 = 8, 99999999 < uVar13)))))) {
      uVar20 = 10 - (uVar13 < 1000000000);
    }
    iVar12 = (uVar19 & 0xfffffff8) + 8;
    uVar28 = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar21 + lVar26 + 2
    ;
    uVar29 = uVar29 & uVar16;
    local_60 = buf;
    do {
      uVar19 = uVar20 - 1;
      switch((ulong)uVar19) {
      case 0:
        cVar23 = (char)uVar22;
        uVar22 = 0;
        goto LAB_00143c68;
      case 1:
        cVar23 = (char)((uVar22 & 0xffffffff) / 10);
        iVar25 = (int)((uVar22 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar23 = (char)((uVar22 & 0xffffffff) / 100);
        iVar25 = (int)((uVar22 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar23 = (char)((uVar22 & 0xffffffff) / 1000);
        iVar25 = (int)((uVar22 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar23 = (char)((uVar22 & 0xffffffff) / 10000);
        iVar25 = (int)((uVar22 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar17 = uVar22 >> 5 & 0x7ffffff;
        cVar23 = (char)(uVar17 / 0xc35);
        iVar25 = (int)(uVar17 / 0xc35) * 100000;
        break;
      case 6:
        cVar23 = (char)((uVar22 & 0xffffffff) / 1000000);
        iVar25 = (int)((uVar22 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar23 = (char)((uVar22 & 0xffffffff) / 10000000);
        iVar25 = (int)((uVar22 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar23 = (char)((uVar22 & 0xffffffff) / 100000000);
        iVar25 = (int)((uVar22 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar17 = (uVar22 >> 9 & 0x7fffff) * 0x44b83;
        cVar23 = (char)(uVar17 >> 0x27);
        iVar25 = (uint)(uVar17 >> 0x27) * 1000000000;
        break;
      default:
        goto switchD_00143f49_default;
      }
      uVar22 = (ulong)(uint)((int)uVar22 - iVar25);
LAB_00143c68:
      in_stack_ffffffffffffff68 = 1;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_78,cVar23 + '0',
                          (&basic_data<void>::powers_of_10_64)[uVar19] << (bVar18 & 0x3f),
                          (uVar22 << (bVar18 & 0x3f)) + uVar29,uVar28,uVar19,true);
      if (rVar14 != more) goto LAB_00143d0d;
      uVar20 = uVar19;
    } while (0 < (int)uVar19);
    do {
      uVar22 = uVar29 * 10;
      uVar28 = uVar28 * 10;
      uVar29 = uVar22 & uVar16;
      uVar19 = uVar19 - 1;
      in_stack_ffffffffffffff68 = 0;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_78,
                          (char)(uVar22 >> (bVar18 & 0x3f)) + '0',uVar27,uVar29,uVar28,uVar19,false)
      ;
    } while (rVar14 == more);
LAB_00143d0d:
    pbVar11 = local_60;
    uVar16 = (ulong)(uint)local_78.size;
    if (rVar14 == error) {
      iVar12 = uVar19 + (local_78.size - iVar12) + 0x15b;
      fallback_format<double>(local_58,local_60,(int *)&stack0xffffffffffffff74);
      return iVar12;
    }
    if (local_78.size < 0) {
LAB_00144125:
      assert_fail((char *)CONCAT44(uVar19,in_stack_ffffffffffffff70),0,
                  (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    if (local_60->capacity_ < uVar16) {
      (**local_60->_vptr_buffer)(local_60,uVar16);
    }
    pbVar11->size_ = uVar16;
LAB_00144185:
    iVar12 = (uVar19 - iVar12) + 0x15c;
  }
  else {
    if ((uint)precision < 0x12) {
      uVar16 = (ulong)value & 0xfffffffffffff;
      if ((ulong)value >> 0x34 == 0) {
        lVar21 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        uVar16 = uVar16 << (~(byte)lVar21 + 0x35 & 0x3f);
        iVar25 = ((uint)lVar21 ^ 0xffffffc0) - 0x426;
      }
      else {
        uVar16 = uVar16 | 0x10000000000000;
        iVar25 = (uint)((ulong)value >> 0x34) - 0x433;
      }
      iVar10 = (int)((ulong)((long)(-0x32 - iVar25) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar19 = iVar10 + 0x15b;
      uVar13 = iVar10 + 0x162;
      if (-1 < (int)uVar19) {
        uVar13 = uVar19;
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar16 << 0xb;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar13 >> 3) * 8 + 8);
      uVar29 = SUB168(auVar5 * auVar9,8) - (SUB168(auVar5 * auVar9,0) >> 0x3f);
      bVar18 = -((char)*(undefined2 *)
                        (basic_data<void>::pow10_exponents + (long)((int)uVar13 >> 3) * 2 + 2) +
                (char)iVar25) - 0x35;
      local_78.buf = buf->ptr_;
      local_78.size = 0;
      local_40 = 1L << (bVar18 & 0x3f);
      local_78.fixed = uVar22 == 0x200000000;
      local_78.exp10 = 0x154 - (uVar13 & 0xfffffff8);
      uVar16 = uVar29 >> (bVar18 & 0x3f);
      uVar20 = (uint)uVar16;
      local_78.precision = precision;
      local_60 = buf;
      local_38 = specs;
      if (uVar20 == 0) goto LAB_001441d2;
      if (uVar16 >> 0x20 != 0) {
        assert_fail((char *)(ulong)in_stack_ffffffffffffff70,0,
                    (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      uVar19 = 1;
      if ((((9 < uVar20) && (uVar19 = 2, 99 < uVar20)) && (uVar19 = 3, 999 < uVar20)) &&
         (((uVar19 = 4, 9999 < uVar20 && (uVar19 = 5, 99999 < uVar20)) &&
          ((uVar19 = 6, 999999 < uVar20 &&
           ((uVar19 = 7, 9999999 < uVar20 && (uVar19 = 8, 99999999 < uVar20)))))))) {
        uVar19 = 10 - (uVar20 < 1000000000);
      }
      local_58 = value;
      rVar14 = fixed_handler::on_start
                         (&local_78,
                          (&basic_data<void>::powers_of_10_64)[uVar19 - 1] << (bVar18 & 0x3f),
                          uVar29 / 10,10,(int *)&stack0xffffffffffffff74);
      if (rVar14 == more) {
        uVar17 = local_40 - 1;
        uVar29 = uVar29 & uVar17;
        uVar20 = uVar19;
        do {
          uVar19 = uVar20 - 1;
          switch((ulong)uVar19) {
          case 0:
            cVar23 = (char)uVar16;
            uVar16 = 0;
            goto LAB_0014402d;
          case 1:
            cVar23 = (char)((uVar16 & 0xffffffff) / 10);
            iVar12 = (int)((uVar16 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar23 = (char)((uVar16 & 0xffffffff) / 100);
            iVar12 = (int)((uVar16 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar23 = (char)((uVar16 & 0xffffffff) / 1000);
            iVar12 = (int)((uVar16 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar23 = (char)((uVar16 & 0xffffffff) / 10000);
            iVar12 = (int)((uVar16 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar24 = uVar16 >> 5 & 0x7ffffff;
            cVar23 = (char)(uVar24 / 0xc35);
            iVar12 = (int)(uVar24 / 0xc35) * 100000;
            break;
          case 6:
            cVar23 = (char)((uVar16 & 0xffffffff) / 1000000);
            iVar12 = (int)((uVar16 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar23 = (char)((uVar16 & 0xffffffff) / 10000000);
            iVar12 = (int)((uVar16 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar23 = (char)((uVar16 & 0xffffffff) / 100000000);
            iVar12 = (int)((uVar16 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar24 = (uVar16 >> 9 & 0x7fffff) * 0x44b83;
            cVar23 = (char)(uVar24 >> 0x27);
            iVar12 = (uint)(uVar24 >> 0x27) * 1000000000;
            break;
          default:
switchD_00143f49_default:
            assert_fail((char *)CONCAT44(uVar20,in_stack_ffffffffffffff70),0,
                        (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          }
          uVar16 = (ulong)(uint)((int)uVar16 - iVar12);
LAB_0014402d:
          in_stack_ffffffffffffff68 = 1;
          rVar14 = fixed_handler::on_digit
                             (&local_78,cVar23 + '0',
                              (&basic_data<void>::powers_of_10_64)[uVar19] << (bVar18 & 0x3f),
                              (uVar16 << (bVar18 & 0x3f)) + uVar29,1,uVar19,true);
          uVar27 = local_40;
          if (rVar14 != more) goto LAB_001440d9;
          uVar20 = uVar19;
        } while (0 < (int)uVar19);
        uVar28 = 1;
        do {
          uVar16 = uVar29 * 10;
          uVar28 = uVar28 * 10;
          uVar29 = uVar16 & uVar17;
          uVar19 = uVar19 - 1;
          in_stack_ffffffffffffff68 = 0;
          rVar14 = fixed_handler::on_digit
                             (&local_78,(char)(uVar16 >> (bVar18 & 0x3f)) + '0',uVar27,uVar29,uVar28
                              ,uVar19,false);
        } while (rVar14 == more);
      }
LAB_001440d9:
      pbVar11 = local_60;
      buf = local_60;
      specs = local_38;
      value = local_58;
      if (rVar14 != error) {
        uVar16 = (ulong)(uint)local_78.size;
        if (local_78.size < 1 || uVar22 == 0x200000000) {
          if (local_78.size < 0) goto LAB_00144125;
        }
        else {
          uVar16 = (ulong)(uint)local_78.size;
          do {
            uVar20 = uVar19 + 1;
            if (local_60->ptr_[uVar16 - 1] != '0') goto LAB_0014416a;
            bVar1 = 1 < uVar16;
            uVar16 = uVar16 - 1;
            uVar19 = uVar20;
          } while (bVar1);
          uVar16 = 0;
        }
LAB_0014416a:
        uVar16 = uVar16 & 0xffffffff;
        if (local_60->capacity_ < uVar16) {
          (**local_60->_vptr_buffer)(local_60,uVar16);
        }
        iVar12 = (uVar13 & 0xfffffff8) + 8;
        pbVar11->size_ = uVar16;
        goto LAB_00144185;
      }
    }
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar12;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}